

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_emwin.cc
# Opt level: O2

void __thiscall EMWINHandler::handle(EMWINHandler *this,shared_ptr<const_lrit::File> *f)

{
  FileWriter *pFVar1;
  bool bVar2;
  string *psVar3;
  void *__buf;
  void *__buf_00;
  EMWINHandler *this_00;
  FilenameBuilder *this_01;
  NOAALRITHeader NVar4;
  string path;
  string text;
  timespec time;
  Zip zip;
  PrimaryHeader ph;
  FilenameBuilder fb;
  allocator local_3f1;
  undefined1 local_3f0 [8];
  undefined1 local_3e8 [32];
  undefined1 local_3c8 [32];
  string local_3a8;
  timespec local_388;
  string local_378;
  string local_358;
  undefined1 local_338 [176];
  PrimaryHeader local_288;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_250 [2];
  _Base_ptr local_230;
  _Base_ptr p_Stack_228;
  AWIPS local_220;
  
  lrit::File::getHeader<lrit::PrimaryHeader>
            (&local_288,(f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  if (local_288.fileType == '\x02') {
    NVar4 = lrit::File::getHeader<lrit::NOAALRITHeader>
                      ((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    if (NVar4.productID == 9) {
      lrit::File::getHeader<lrit::AnnotationHeader>
                ((AnnotationHeader *)local_270,
                 (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      this_00 = (EMWINHandler *)(local_270 + 8);
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      if ((undefined1 *)local_270._8_8_ == local_260 + 8) {
        local_3a8.field_2._8_8_ = aaStack_250[0]._0_8_;
      }
      else {
        local_3a8._M_dataplus._M_p = (pointer)local_270._8_8_;
      }
      local_3a8._M_string_length = local_260._0_8_;
      local_260._0_8_ = 0;
      local_260[8] = '\0';
      local_270._8_8_ = local_260 + 8;
      std::__cxx11::string::~string((string *)this_00);
      local_388.tv_sec = 0;
      local_388.tv_nsec = 0;
      bVar2 = extractTimeStamp(this_00,&local_3a8,&local_388);
      if (bVar2) {
        this_01 = (FilenameBuilder *)local_270;
        FilenameBuilder::FilenameBuilder(this_01);
        std::__cxx11::string::_M_assign((string *)this_01);
        local_230 = (_Base_ptr)local_388.tv_sec;
        p_Stack_228 = (_Base_ptr)local_388.tv_nsec;
        bVar2 = extractAWIPS((EMWINHandler *)this_01,&local_3a8,&local_220);
        if (bVar2) {
          if (NVar4.noaaSpecificCompression == '\0') {
            removeSuffix((string *)local_338,&local_3a8);
            std::__cxx11::string::operator=
                      ((string *)aaStack_250[0]._M_local_buf,(string *)local_338);
            std::__cxx11::string::~string((string *)local_338);
            std::__cxx11::string::string((string *)local_3e8,"{filename}",(allocator *)local_3c8);
            std::__cxx11::string::string((string *)&local_378,"TXT",&local_3f1);
            psVar3 = &local_378;
            FilenameBuilder::build
                      ((string *)local_338,(FilenameBuilder *)local_270,(string *)local_3e8,psVar3);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)local_3e8);
            pFVar1 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            lrit::File::read((File *)local_3e8,
                             (int)(f->
                                  super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr,__buf_00,(size_t)psVar3);
            FileWriter::write(pFVar1,(int)local_338,local_3e8,0);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      ((_Vector_base<char,_std::allocator<char>_> *)local_3e8);
            if ((this->config_).json == true) {
              FileWriter::writeHeader
                        ((this->fileWriter_).
                         super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(string *)local_338);
            }
            std::__cxx11::string::~string((string *)local_338);
          }
          else if ((NVar4._14_2_ & 0xff) == 10) {
            lrit::File::getData((File *)local_3f0);
            Zip::Zip((Zip *)local_338,
                     (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      *)local_3f0);
            if (local_3f0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_3f0 + 8))();
            }
            local_3f0 = (undefined1  [8])0x0;
            std::__cxx11::string::string((string *)local_3e8,(string *)(local_338 + 0x70));
            std::__cxx11::string::operator=
                      ((string *)aaStack_250[0]._M_local_buf,(string *)local_3e8);
            std::__cxx11::string::~string((string *)local_3e8);
            std::__cxx11::string::string((string *)local_3c8,"{filename}",&local_3f1);
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            local_358._M_string_length = 0;
            local_358.field_2._M_local_buf[0] = '\0';
            psVar3 = &local_358;
            FilenameBuilder::build
                      ((string *)local_3e8,(FilenameBuilder *)local_270,(string *)local_3c8,psVar3);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)local_3c8);
            pFVar1 = (this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            Zip::read((Zip *)local_3c8,(int)local_338,__buf,(size_t)psVar3);
            FileWriter::write(pFVar1,(int)local_3e8,local_3c8,0);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      ((_Vector_base<char,_std::allocator<char>_> *)local_3c8);
            if ((this->config_).json == true) {
              FileWriter::writeHeader
                        ((this->fileWriter_).
                         super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,(string *)local_3e8);
            }
            std::__cxx11::string::~string((string *)local_3e8);
            Zip::~Zip((Zip *)local_338);
          }
        }
        FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_270);
      }
      std::__cxx11::string::~string((string *)&local_3a8);
    }
  }
  return;
}

Assistant:

void EMWINHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 2 ) {
    return;
  }

  // Filter EMWIN
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != 9) {
    return;
  }

  // Extract time stamp from filename
  auto text = f->getHeader<lrit::AnnotationHeader>().text;
  struct timespec time = {0, 0};
  if (!extractTimeStamp(text, time)) {
    return;
  }

  FilenameBuilder fb;
  fb.dir = config_.dir;
  fb.time = time;

  // Assume we can extract WMO abbreviated heading from filename
  if (!extractAWIPS(text, fb.awips)) {
    return;
  }

  // Decompress if this is a ZIP file
  if (nlh.noaaSpecificCompression == 10) {
    try {
      auto zip = Zip(f->getData());
      fb.filename = zip.fileName();

      // Use filename and extension straight from ZIP file
      const auto path = fb.build("{filename}");
      fileWriter_->write(path, zip.read());
      if (config_.json) {
        fileWriter_->writeHeader(*f, path);
      }
    } catch (const Zip::SignatureError& error) {
      std::cout << "Ignoring " << text << ": " << error.what() << std::endl;
    }
    return;
  }

  // Write with TXT extension if this is not a compressed file
  if (nlh.noaaSpecificCompression == 0) {
    fb.filename = removeSuffix(text);

    // Compressed TXT files also use the uppercase TXT extension
    const auto path = fb.build("{filename}", "TXT");
    fileWriter_->write(path, f->read());
    if (config_.json) {
      fileWriter_->writeHeader(*f, path);
    }
    return;
  }
}